

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gentl_wrapper_linux.cc
# Opt level: O0

void __thiscall rcg::GenTLWrapper::GenTLWrapper(GenTLWrapper *this,string *filename)

{
  undefined8 uVar1;
  invalid_argument *piVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 *in_RDI;
  string tmp;
  char *err;
  char *in_stack_fffffffffffffef0;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffef8;
  allocator local_d9;
  string local_d8 [32];
  string local_b8 [39];
  allocator local_91;
  string local_90 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_70;
  undefined1 local_65;
  allocator local_51;
  string local_50 [32];
  string local_30 [48];
  
  uVar1 = std::__cxx11::string::c_str();
  uVar1 = dlopen(uVar1,10);
  in_RDI[0x39] = uVar1;
  if (in_RDI[0x39] == 0) {
    local_65 = 1;
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"Cannot open GenTL library: ",&local_51);
    dlerror();
    std::operator+(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0);
    std::invalid_argument::invalid_argument(piVar2,local_30);
    local_65 = 0;
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  dlerror();
  uVar1 = dlsym(in_RDI[0x39],"GCInitLib");
  in_RDI[2] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"GCCloseLib");
  in_RDI[3] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"GCGetInfo");
  *in_RDI = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"GCGetLastError");
  in_RDI[1] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"GCReadPort");
  in_RDI[4] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"GCWritePort");
  in_RDI[5] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"GCGetPortURL");
  in_RDI[6] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"GCGetPortInfo");
  in_RDI[7] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"GCRegisterEvent");
  in_RDI[8] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"GCUnregisterEvent");
  in_RDI[9] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"EventGetData");
  in_RDI[10] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"EventGetDataInfo");
  in_RDI[0xb] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"EventGetInfo");
  in_RDI[0xc] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"EventFlush");
  in_RDI[0xd] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"EventKill");
  in_RDI[0xe] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"TLOpen");
  in_RDI[0xf] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"TLClose");
  in_RDI[0x10] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"TLGetInfo");
  in_RDI[0x11] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"TLGetNumInterfaces");
  in_RDI[0x12] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"TLGetInterfaceID");
  in_RDI[0x13] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"TLGetInterfaceInfo");
  in_RDI[0x14] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"TLOpenInterface");
  in_RDI[0x15] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"TLUpdateInterfaceList");
  in_RDI[0x16] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"IFClose");
  in_RDI[0x17] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"IFGetInfo");
  in_RDI[0x18] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"IFGetNumDevices");
  in_RDI[0x19] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"IFGetDeviceID");
  in_RDI[0x1a] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"IFUpdateDeviceList");
  in_RDI[0x1b] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"IFGetDeviceInfo");
  in_RDI[0x1c] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"IFOpenDevice");
  in_RDI[0x1d] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DevGetPort");
  in_RDI[0x1e] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DevGetNumDataStreams");
  in_RDI[0x1f] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DevGetDataStreamID");
  in_RDI[0x20] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DevOpenDataStream");
  in_RDI[0x21] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DevGetInfo");
  in_RDI[0x22] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DevClose");
  in_RDI[0x23] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DSAnnounceBuffer");
  in_RDI[0x24] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DSAllocAndAnnounceBuffer");
  in_RDI[0x25] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DSFlushQueue");
  in_RDI[0x26] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DSStartAcquisition");
  in_RDI[0x27] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DSStopAcquisition");
  in_RDI[0x28] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DSGetInfo");
  in_RDI[0x29] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DSGetBufferID");
  in_RDI[0x2a] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DSClose");
  in_RDI[0x2b] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DSRevokeBuffer");
  in_RDI[0x2c] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DSQueueBuffer");
  in_RDI[0x2d] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DSGetBufferInfo");
  in_RDI[0x2e] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"GCGetNumPortURLs");
  in_RDI[0x2f] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"GCGetPortURLInfo");
  in_RDI[0x30] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"GCReadPortStacked");
  in_RDI[0x31] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"GCWritePortStacked");
  in_RDI[0x32] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DSGetBufferChunkData");
  in_RDI[0x33] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"IFGetParentTL");
  in_RDI[0x34] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DevGetParentIF");
  in_RDI[0x35] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DSGetParentDev");
  in_RDI[0x36] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DSGetNumBufferParts");
  in_RDI[0x37] = uVar1;
  uVar1 = dlsym(in_RDI[0x39],"DSGetBufferPartInfo");
  in_RDI[0x38] = uVar1;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)dlerror();
  if (__lhs != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    local_70 = __lhs;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,(char *)__lhs,&local_91);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    dlclose(in_RDI[0x39]);
    piVar2 = (invalid_argument *)__cxa_allocate_exception(0x10);
    __rhs = &local_d9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d8,"Cannot resolve GenTL symbol: ",__rhs);
    std::operator+(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs)
    ;
    std::invalid_argument::invalid_argument(piVar2,local_b8);
    __cxa_throw(piVar2,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  return;
}

Assistant:

GenTLWrapper::GenTLWrapper(const std::string &filename)
{
  // open library

  // NOTE: RTLD_DEEPBIND is necessary for resolving symbols of the loaded
  // library locally before using global symbols. This is for example needed
  // if rc_genicam_api is used in a ROS node or nodelet and a transport layer
  // library internally uses boost in a different version as in ROS.

  lib=dlopen(filename.c_str(), RTLD_NOW | RTLD_DEEPBIND);

  if (lib == 0)
  {
    throw std::invalid_argument(std::string("Cannot open GenTL library: ")+dlerror());
  }

  dlerror(); // clear possible existing error

  // resolve function calls that will only be used privately

  *reinterpret_cast<void**>(&GCInitLib)=dlsym(lib, "GCInitLib");
  *reinterpret_cast<void**>(&GCCloseLib)=dlsym(lib, "GCCloseLib");

  // resolve public symbols

  *reinterpret_cast<void**>(&GCGetInfo)=dlsym(lib, "GCGetInfo");
  *reinterpret_cast<void**>(&GCGetLastError)=dlsym(lib, "GCGetLastError");
  *reinterpret_cast<void**>(&GCReadPort)=dlsym(lib, "GCReadPort");
  *reinterpret_cast<void**>(&GCWritePort)=dlsym(lib, "GCWritePort");
  *reinterpret_cast<void**>(&GCGetPortURL)=dlsym(lib, "GCGetPortURL");
  *reinterpret_cast<void**>(&GCGetPortInfo)=dlsym(lib, "GCGetPortInfo");

  *reinterpret_cast<void**>(&GCRegisterEvent)=dlsym(lib, "GCRegisterEvent");
  *reinterpret_cast<void**>(&GCUnregisterEvent)=dlsym(lib, "GCUnregisterEvent");
  *reinterpret_cast<void**>(&EventGetData)=dlsym(lib, "EventGetData");
  *reinterpret_cast<void**>(&EventGetDataInfo)=dlsym(lib, "EventGetDataInfo");
  *reinterpret_cast<void**>(&EventGetInfo)=dlsym(lib, "EventGetInfo");
  *reinterpret_cast<void**>(&EventFlush)=dlsym(lib, "EventFlush");
  *reinterpret_cast<void**>(&EventKill)=dlsym(lib, "EventKill");
  *reinterpret_cast<void**>(&TLOpen)=dlsym(lib, "TLOpen");
  *reinterpret_cast<void**>(&TLClose)=dlsym(lib, "TLClose");
  *reinterpret_cast<void**>(&TLGetInfo)=dlsym(lib, "TLGetInfo");
  *reinterpret_cast<void**>(&TLGetNumInterfaces)=dlsym(lib, "TLGetNumInterfaces");
  *reinterpret_cast<void**>(&TLGetInterfaceID)=dlsym(lib, "TLGetInterfaceID");
  *reinterpret_cast<void**>(&TLGetInterfaceInfo)=dlsym(lib, "TLGetInterfaceInfo");
  *reinterpret_cast<void**>(&TLOpenInterface)=dlsym(lib, "TLOpenInterface");
  *reinterpret_cast<void**>(&TLUpdateInterfaceList)=dlsym(lib, "TLUpdateInterfaceList");
  *reinterpret_cast<void**>(&IFClose)=dlsym(lib, "IFClose");
  *reinterpret_cast<void**>(&IFGetInfo)=dlsym(lib, "IFGetInfo");
  *reinterpret_cast<void**>(&IFGetNumDevices)=dlsym(lib, "IFGetNumDevices");
  *reinterpret_cast<void**>(&IFGetDeviceID)=dlsym(lib, "IFGetDeviceID");
  *reinterpret_cast<void**>(&IFUpdateDeviceList)=dlsym(lib, "IFUpdateDeviceList");
  *reinterpret_cast<void**>(&IFGetDeviceInfo)=dlsym(lib, "IFGetDeviceInfo");
  *reinterpret_cast<void**>(&IFOpenDevice)=dlsym(lib, "IFOpenDevice");

  *reinterpret_cast<void**>(&DevGetPort)=dlsym(lib, "DevGetPort");
  *reinterpret_cast<void**>(&DevGetNumDataStreams)=dlsym(lib, "DevGetNumDataStreams");
  *reinterpret_cast<void**>(&DevGetDataStreamID)=dlsym(lib, "DevGetDataStreamID");
  *reinterpret_cast<void**>(&DevOpenDataStream)=dlsym(lib, "DevOpenDataStream");
  *reinterpret_cast<void**>(&DevGetInfo)=dlsym(lib, "DevGetInfo");
  *reinterpret_cast<void**>(&DevClose)=dlsym(lib, "DevClose");

  *reinterpret_cast<void**>(&DSAnnounceBuffer)=dlsym(lib, "DSAnnounceBuffer");
  *reinterpret_cast<void**>(&DSAllocAndAnnounceBuffer)=dlsym(lib, "DSAllocAndAnnounceBuffer");
  *reinterpret_cast<void**>(&DSFlushQueue)=dlsym(lib, "DSFlushQueue");
  *reinterpret_cast<void**>(&DSStartAcquisition)=dlsym(lib, "DSStartAcquisition");
  *reinterpret_cast<void**>(&DSStopAcquisition)=dlsym(lib, "DSStopAcquisition");
  *reinterpret_cast<void**>(&DSGetInfo)=dlsym(lib, "DSGetInfo");
  *reinterpret_cast<void**>(&DSGetBufferID)=dlsym(lib, "DSGetBufferID");
  *reinterpret_cast<void**>(&DSClose)=dlsym(lib, "DSClose");
  *reinterpret_cast<void**>(&DSRevokeBuffer)=dlsym(lib, "DSRevokeBuffer");
  *reinterpret_cast<void**>(&DSQueueBuffer)=dlsym(lib, "DSQueueBuffer");
  *reinterpret_cast<void**>(&DSGetBufferInfo)=dlsym(lib, "DSGetBufferInfo");

  *reinterpret_cast<void**>(&GCGetNumPortURLs)=dlsym(lib, "GCGetNumPortURLs");
  *reinterpret_cast<void**>(&GCGetPortURLInfo)=dlsym(lib, "GCGetPortURLInfo");
  *reinterpret_cast<void**>(&GCReadPortStacked)=dlsym(lib, "GCReadPortStacked");
  *reinterpret_cast<void**>(&GCWritePortStacked)=dlsym(lib, "GCWritePortStacked");

  *reinterpret_cast<void**>(&DSGetBufferChunkData)=dlsym(lib, "DSGetBufferChunkData");

  *reinterpret_cast<void**>(&IFGetParentTL)=dlsym(lib, "IFGetParentTL");
  *reinterpret_cast<void**>(&DevGetParentIF)=dlsym(lib, "DevGetParentIF");
  *reinterpret_cast<void**>(&DSGetParentDev)=dlsym(lib, "DSGetParentDev");

  *reinterpret_cast<void**>(&DSGetNumBufferParts)=dlsym(lib, "DSGetNumBufferParts");
  *reinterpret_cast<void**>(&DSGetBufferPartInfo)=dlsym(lib, "DSGetBufferPartInfo");

  const char *err=dlerror();

  if (err != 0)
  {
    std::string tmp=err;
    dlclose(lib);
    throw std::invalid_argument(std::string("Cannot resolve GenTL symbol: ")+tmp);
  }
}